

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

sqlite3_value * sqlite3_value_dup(sqlite3_value *pOrig)

{
  ushort uVar1;
  u16 uVar2;
  u8 uVar3;
  u8 uVar4;
  int iVar5;
  Mem *pMem;
  
  if (((pOrig != (sqlite3_value *)0x0) && (iVar5 = sqlite3_initialize(), iVar5 == 0)) &&
     (pMem = (Mem *)sqlite3Malloc(0x38), pMem != (Mem *)0x0)) {
    pMem->szMalloc = 0;
    pMem->uTemp = 0;
    pMem->db = (sqlite3 *)0x0;
    pMem->z = (char *)0x0;
    pMem->zMalloc = (char *)0x0;
    (pMem->u).r = 0.0;
    pMem->flags = 0;
    pMem->enc = '\0';
    pMem->eSubtype = '\0';
    pMem->n = 0;
    pMem->xDel = (_func_void_void_ptr *)0x0;
    uVar2 = pOrig->flags;
    uVar3 = pOrig->enc;
    uVar4 = pOrig->eSubtype;
    iVar5 = pOrig->n;
    pMem->u = pOrig->u;
    pMem->flags = uVar2;
    pMem->enc = uVar3;
    pMem->eSubtype = uVar4;
    pMem->n = iVar5;
    pMem->z = pOrig->z;
    uVar1 = pMem->flags;
    pMem->flags = uVar1 & 0xfbff;
    pMem->db = (sqlite3 *)0x0;
    if ((uVar1 & 0x12) == 0) {
      return pMem;
    }
    pMem->flags = uVar1 & 0xe3ff | 0x1000;
    iVar5 = sqlite3VdbeMemMakeWriteable(pMem);
    if (iVar5 == 0) {
      return pMem;
    }
    sqlite3ValueFree(pMem);
  }
  return (sqlite3_value *)0x0;
}

Assistant:

SQLITE_API sqlite3_value *sqlite3_value_dup(const sqlite3_value *pOrig){
  sqlite3_value *pNew;
  if( pOrig==0 ) return 0;
  pNew = sqlite3_malloc( sizeof(*pNew) );
  if( pNew==0 ) return 0;
  memset(pNew, 0, sizeof(*pNew));
  memcpy(pNew, pOrig, MEMCELLSIZE);
  pNew->flags &= ~MEM_Dyn;
  pNew->db = 0;
  if( pNew->flags&(MEM_Str|MEM_Blob) ){
    pNew->flags &= ~(MEM_Static|MEM_Dyn);
    pNew->flags |= MEM_Ephem;
    if( sqlite3VdbeMemMakeWriteable(pNew)!=SQLITE_OK ){
      sqlite3ValueFree(pNew);
      pNew = 0;
    }
  }
  return pNew;
}